

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

void make_terrible(artifact *art,object *obj)

{
  short sVar1;
  obj_property *poVar2;
  _Bool _Var3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  wchar_t pick_00;
  wchar_t wVar8;
  bitflag *flags_00;
  uint local_110;
  element_info *local_100;
  int local_f0;
  int16_t *local_e8;
  int16_t *local_e0;
  int16_t *local_d8;
  int16_t *local_d0;
  int16_t *local_c8;
  int local_c0;
  int16_t *local_b8;
  object_kind *local_b0;
  wchar_t power;
  wchar_t pick;
  wchar_t tval;
  wchar_t level_1;
  obj_property *prop;
  int16_t *level;
  _Bool *brand;
  _Bool *slay;
  bitflag *flags;
  int16_t *bonus_5;
  int16_t *bonus_4;
  int16_t *bonus_3;
  int16_t *bonus_2;
  int16_t *bonus_1;
  int16_t *bonus;
  wchar_t penalty;
  wchar_t wheel_of_doom;
  wchar_t j;
  _Bool weapon;
  object_kind *kind;
  wchar_t num_curses;
  wchar_t gauntlet_runs;
  wchar_t i;
  object *obj_local;
  artifact *art_local;
  
  kind._4_4_ = 1;
  if (art == (artifact *)0x0) {
    local_b0 = lookup_kind((uint)obj->tval,(uint)obj->sval);
  }
  else {
    local_b0 = lookup_kind(art->tval,art->sval);
  }
  _Var3 = tval_is_melee_weapon_k(local_b0);
  if (L'ஷ' < potential) {
    kind._4_4_ = 2;
  }
  if ((L'ණ' < potential) && (uVar6 = Rand_div(3), uVar6 != 0)) {
    kind._4_4_ = kind._4_4_ + 1;
  }
  if (((art == (artifact *)0x0) || (art->activation == (activation *)0x0)) ||
     (uVar6 = Rand_div(3), uVar6 == 0)) {
    if (((obj != (object *)0x0) && (obj->activation != (activation *)0x0)) &&
       (uVar6 = Rand_div(3), uVar6 != 0)) {
      obj->activation = (activation *)0x0;
    }
  }
  else {
    art->activation = (activation *)0x0;
  }
  uVar6 = Rand_div(2);
  for (num_curses = L'\0'; num_curses < uVar6 + L'\x02'; num_curses = num_curses + L'\x01') {
    if (((_Var3) && (_Var4 = has_property(art,obj,"skill bonus"), _Var4)) &&
       (uVar7 = Rand_div(2), uVar7 == 0)) {
      bonus._4_4_ = 2;
    }
    else {
      _Var4 = has_property(art,obj,"armor bonus");
      if ((_Var4) && (uVar7 = Rand_div(2), uVar7 == 0)) {
        bonus._4_4_ = 1;
      }
      else {
        uVar7 = Rand_div(2);
        bonus._4_4_ = uVar7 + 3;
      }
    }
    if (bonus._4_4_ == 1) {
      if (art == (artifact *)0x0) {
        if ((obj->ac == 0) || (uVar7 = Rand_div(6), uVar7 != 0)) {
          uVar7 = Rand_div(4);
          if (uVar7 == 0) {
            uVar7 = Rand_div(3);
            obj->to_a = ((short)uVar7 + 3) * -5;
          }
        }
        else {
          obj->ac = 0;
        }
      }
      else {
        if ((art->ac != 0) && (uVar7 = Rand_div(6), uVar7 == 0)) {
          art->cost = art->cost + art->ac * -500;
          art->ac = 0;
        }
        if ((art->tval < 10) || (art->to_a < 0)) {
          uVar7 = Rand_div(4);
          if ((uVar7 == 0) && (art->tval < 10)) {
            uVar7 = Rand_div(3);
            art->to_a = (short)(uVar7 + 3) * -5;
            art->cost = art->cost + (uVar7 + 3) * -1000;
          }
        }
        else {
          uVar7 = Rand_div(7);
          art->to_a = ((short)uVar7 + 6) * -2;
        }
        if (art->to_a < 0) {
          art->cost = art->cost + art->to_a * 400;
        }
      }
    }
    if (bonus._4_4_ == 2) {
      if (art == (artifact *)0x0) {
        uVar7 = Rand_div(2);
        if (uVar7 == 0) {
          uVar7 = Rand_div(7);
          obj->to_h = ((short)uVar7 + 6) * -2;
          uVar7 = Rand_div(3);
          if (uVar7 != 0) {
            uVar7 = Rand_div(7);
            obj->to_d = ((short)uVar7 + 6) * -2;
          }
        }
        else {
          if (0 < obj->to_h) {
            obj->to_h = -obj->to_h;
          }
          if (0 < obj->to_d) {
            obj->to_d = -obj->to_d;
          }
          if (((obj->to_d == 0) && (obj->to_h == 0)) && (uVar7 = Rand_div(5), uVar7 == 0)) {
            uVar7 = Rand_div(4);
            sVar1 = (short)uVar7 + 2;
            obj->to_h = obj->to_h + sVar1 * -5;
            obj->to_d = obj->to_d + sVar1 * -5;
          }
        }
      }
      else {
        _Var4 = tval_is_weapon_a(art);
        if (_Var4) {
          uVar7 = Rand_div(7);
          art->to_h = ((short)uVar7 + 6) * -2;
          uVar7 = Rand_div(3);
          if (uVar7 != 0) {
            uVar7 = Rand_div(7);
            art->to_d = ((short)uVar7 + 6) * -2;
          }
        }
        else {
          if (0 < art->to_h) {
            art->to_h = -art->to_h;
          }
          if (0 < art->to_d) {
            art->to_d = -art->to_d;
          }
          if (((art->to_d == 0) && (art->to_h == 0)) && (uVar7 = Rand_div(5), uVar7 == 0)) {
            uVar7 = Rand_div(4);
            sVar1 = (short)uVar7 + 2;
            art->to_h = art->to_h + sVar1 * -5;
            art->to_d = art->to_d + sVar1 * -5;
          }
        }
        if ((art->to_d < 0) && (art->to_h < 0)) {
          art->cost = art->cost + -10000;
        }
        else if ((art->to_d < 0) || (art->to_h < 0)) {
          art->cost = art->cost + -5000;
        }
        if (art->cost < 0) {
          art->cost = 0;
        }
      }
    }
    if (bonus._4_4_ == 3) {
      uVar7 = Rand_div(3);
      if (uVar7 == 0) {
        uVar7 = Rand_div(5);
        bonus._0_2_ = -3 - ((short)uVar7 + 1);
        uVar7 = Rand_div(3);
        if (uVar7 == 0) {
          bonus._0_2_ = (short)bonus * 5;
        }
        for (penalty = L'\0'; penalty < L'\x11'; penalty = penalty + L'\x01') {
          if (art == (artifact *)0x0) {
            local_c8 = obj->modifiers + penalty;
          }
          else {
            local_c8 = art->modifiers + penalty;
          }
          *local_c8 = 0;
        }
        uVar7 = Rand_div(5);
        if (uVar7 == 0) {
          for (penalty = L'\0'; penalty < L'\x05'; penalty = penalty + L'\x01') {
            if (art == (artifact *)0x0) {
              local_d0 = obj->modifiers + penalty;
            }
            else {
              local_d0 = art->modifiers + penalty;
            }
            if (penalty == L'\0') {
              *local_d0 = (short)bonus;
            }
            if (penalty == L'\x03') {
              *local_d0 = (short)bonus;
            }
            if (penalty == L'\x04') {
              *local_d0 = (short)bonus;
            }
          }
        }
        else {
          uVar7 = Rand_div(4);
          if (uVar7 == 0) {
            for (penalty = L'\0'; penalty < L'\x05'; penalty = penalty + L'\x01') {
              if (art == (artifact *)0x0) {
                local_d8 = obj->modifiers + penalty;
              }
              else {
                local_d8 = art->modifiers + penalty;
              }
              if (penalty == L'\x02') {
                *local_d8 = (short)bonus;
              }
              if (penalty == L'\x01') {
                *local_d8 = (short)bonus;
              }
            }
          }
          else {
            uVar7 = Rand_div(6);
            if (uVar7 == 0) {
              if (art == (artifact *)0x0) {
                local_e0 = obj->modifiers;
              }
              else {
                local_e0 = art->modifiers;
              }
              local_e0 = local_e0 + 9;
              *local_e0 = (short)bonus;
            }
            else {
              for (penalty = L'\0'; penalty < L'\x05'; penalty = penalty + L'\x01') {
                if (art == (artifact *)0x0) {
                  local_e8 = obj->modifiers + penalty;
                }
                else {
                  local_e8 = art->modifiers + penalty;
                }
                uVar7 = Rand_div(4);
                if (uVar7 == 0) {
                  *local_e8 = (short)bonus;
                }
              }
            }
          }
        }
        uVar7 = Rand_div(2);
        kind._4_4_ = uVar7 + 1 + kind._4_4_;
        if (art != (artifact *)0x0) {
          if ((long)art->cost + -60000 < 0) {
            local_f0 = 0;
          }
          else {
            local_f0 = art->cost + -60000;
          }
          art->cost = local_f0;
        }
      }
      else {
        for (penalty = L'\0'; penalty < L'\x05'; penalty = penalty + L'\x01') {
          if (art == (artifact *)0x0) {
            local_b8 = obj->modifiers + penalty;
          }
          else {
            local_b8 = art->modifiers + penalty;
          }
          if (0 < *local_b8) {
            *local_b8 = -*local_b8;
          }
        }
        if (art != (artifact *)0x0) {
          if ((long)art->cost + -30000 < 0) {
            local_c0 = 0;
          }
          else {
            local_c0 = art->cost + -30000;
          }
          art->cost = local_c0;
        }
      }
    }
    if (bonus._4_4_ == 4) {
      if (art == (artifact *)0x0) {
        flags_00 = obj->flags;
        obj->modifiers[10] = 0;
      }
      else {
        flags_00 = art->flags;
        art->modifiers[10] = 0;
      }
      uVar7 = Rand_div(4);
      if (uVar7 == 0) {
        if (art == (artifact *)0x0) {
          obj->modifiers[0xb] = 0;
        }
        else {
          art->modifiers[0xb] = 0;
        }
      }
      uVar7 = Rand_div(4);
      if (uVar7 == 0) {
        if (art == (artifact *)0x0) {
          obj->modifiers[0xc] = 0;
        }
        else {
          art->modifiers[0xc] = 0;
        }
      }
      for (num_curses = L'\0'; num_curses < (int)(uint)z_info->slay_max;
          num_curses = num_curses + L'\x01') {
        brand = (_Bool *)0x0;
        if ((art != (artifact *)0x0) && (art->slays != (_Bool *)0x0)) {
          brand = art->slays + num_curses;
        }
        if ((obj != (object *)0x0) && (obj->slays != (_Bool *)0x0)) {
          brand = obj->slays + num_curses;
        }
        uVar7 = Rand_div(3);
        if ((uVar7 == 0) && (brand != (_Bool *)0x0)) {
          *brand = false;
        }
      }
      num_curses = L'\0';
      while (((num_curses < (int)(uint)z_info->slay_max &&
              (((art == (artifact *)0x0 || (art->slays == (_Bool *)0x0)) ||
               ((art->slays[num_curses] & 1U) == 0)))) &&
             (((obj == (object *)0x0 || (obj->slays == (_Bool *)0x0)) ||
              ((obj->slays[num_curses] & 1U) == 0))))) {
        num_curses = num_curses + L'\x01';
      }
      if ((art == (artifact *)0x0) || (num_curses != (uint)z_info->slay_max)) {
        if ((obj != (object *)0x0) && (num_curses == (uint)z_info->slay_max)) {
          mem_free(obj->slays);
          obj->slays = (_Bool *)0x0;
        }
      }
      else {
        mem_free(art->slays);
        art->slays = (_Bool *)0x0;
      }
      uVar7 = Rand_div(3);
      if (uVar7 == 0) {
        flag_off(flags_00,6,0x2a);
      }
      for (num_curses = L'\0'; num_curses < (int)(uint)z_info->brand_max;
          num_curses = num_curses + L'\x01') {
        level = (int16_t *)0x0;
        if ((art != (artifact *)0x0) && (art->brands != (_Bool *)0x0)) {
          level = (int16_t *)(art->brands + num_curses);
        }
        if ((obj != (object *)0x0) && (obj->brands != (_Bool *)0x0)) {
          level = (int16_t *)(obj->brands + num_curses);
        }
        uVar7 = Rand_div(3);
        if ((uVar7 == 0) && (level != (int16_t *)0x0)) {
          *(undefined1 *)level = 0;
        }
      }
      num_curses = L'\0';
      while (((num_curses < (int)(uint)z_info->brand_max &&
              (((art == (artifact *)0x0 || (art->brands == (_Bool *)0x0)) ||
               ((art->brands[num_curses] & 1U) == 0)))) &&
             (((obj == (object *)0x0 || (obj->brands == (_Bool *)0x0)) ||
              ((obj->brands[num_curses] & 1U) == 0))))) {
        num_curses = num_curses + L'\x01';
      }
      if ((art == (artifact *)0x0) || (num_curses != (uint)z_info->brand_max)) {
        if ((obj != (object *)0x0) && (num_curses == (uint)z_info->brand_max)) {
          mem_free(obj->brands);
          obj->brands = (_Bool *)0x0;
        }
      }
      else {
        mem_free(art->brands);
        art->brands = (_Bool *)0x0;
      }
      for (num_curses = L'\0'; num_curses < L'\r'; num_curses = num_curses + L'\x01') {
        if (art == (artifact *)0x0) {
          local_100 = obj->el_info + num_curses;
        }
        else {
          local_100 = art->el_info + num_curses;
        }
        uVar7 = Rand_div(3);
        if ((uVar7 == 0) && (local_100->res_level < 100)) {
          local_100->res_level = local_100->res_level + (100 - local_100->res_level) * 2;
        }
      }
      for (num_curses = L'\0'; poVar2 = obj_properties, num_curses < (int)(uint)z_info->property_max
          ; num_curses = num_curses + L'\x01') {
        uVar7 = Rand_div(3);
        if (((uVar7 == 0) && (poVar2[num_curses].type == L'\x03')) &&
           ((poVar2[num_curses].subtype == L'\x02' || (poVar2[num_curses].subtype == L'\x03')))) {
          flag_off(flags_00,6,poVar2[num_curses].index);
        }
      }
      if ((art != (artifact *)0x0) && (0 < art->cost)) {
        art->cost = art->cost / 3;
      }
    }
  }
  if ((art != (artifact *)0x0) && (art->cost < 0)) {
    art->cost = 0;
  }
  while (kind._4_4_ != 0) {
    if (art == (artifact *)0x0) {
      wVar8 = obj->kind->alloc_min;
      local_110 = (uint)obj->tval;
    }
    else {
      wVar8 = art->alloc_min;
      local_110 = art->tval;
    }
    uVar6 = Rand_div(z_info->curse_max - 1);
    pick_00 = uVar6 + L'\x01';
    uVar6 = Rand_div(9);
    iVar5 = m_bonus(9,wVar8);
    wVar8 = uVar6 + 1 + iVar5 * 10;
    if ((curses[pick_00].poss[(int)local_110] & 1U) != 0) {
      if (art == (artifact *)0x0) {
        append_object_curse(obj,pick_00,wVar8);
      }
      else {
        append_artifact_curse(art,pick_00,wVar8);
      }
      kind._4_4_ = kind._4_4_ + -1;
    }
  }
  return;
}

Assistant:

static void make_terrible(struct artifact *art, struct object *obj)
{
	int i, gauntlet_runs;
	int num_curses = 1;
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	bool weapon = tval_is_melee_weapon_k(kind);

	/* Determine whether the artifact's magics are perilous enough to warrant
	 * extra curses. */
	if (potential >= 3000) {
		num_curses++;
	}
	if ((potential >= 3500) && !one_in_(3)) {
		num_curses++;
	}

	/* Greatly decrease the chance for an activation. */
	if (art && art->activation && !one_in_(3)) {
		art->activation = NULL;
	} else if (obj && obj->activation && !one_in_(3)) {
		obj->activation = NULL;
	}

	/* Force the artifact though the gauntlet two or three times. */
	gauntlet_runs = 1 + randint1(2);
	for (i = 0; i < gauntlet_runs; i++) {
		int j, wheel_of_doom, penalty = 0;

		/* Choose a curse, biased towards penalties to_a, to_d, and to_h. */
		if (weapon && has_property(art, obj, "skill bonus") && one_in_(2)) {
			wheel_of_doom = 2;
		} else if (has_property(art, obj, "armor bonus") && one_in_(2)) {
			wheel_of_doom = 1;
		} else {
			wheel_of_doom = 2 + randint1(2);
		}
		/* Blast base armour class or inflict a penalty to armour class. */
		if (wheel_of_doom == 1) {

			if (art) {
				/* Blast armour and twist magics. */
				if ((art->ac) && (one_in_(6))) {
					art->cost -= 500L * art->ac;
					art->ac = 0;
				}
				if ((art->tval >= TV_BOOTS) && (art->to_a >= 0)) {
					art->to_a = -(5 + randint1(7)) * 2;
				} else if ((one_in_(4)) && (art->tval < TV_BOOTS)) {
					/* Chance of a truly nasty effect for weapons. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					art->to_a = -penalty;
					art->cost -= penalty * 200L;
				}

				/* Artifact might very well still have some value. */
				if (art->to_a < 0) {
					art->cost += art->to_a * 400L;
				}
			} else {
				/* Invert armour class. */
				if ((obj->ac) && (randint1(6) == 1)) {
					obj->ac = 0;
				} else if (randint1(4) == 1) {
					/* Chance of a truly nasty effect. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					obj->to_a = -penalty;
				}
			}
		}

		/* Make either the Skill or Deadliness bonus negative, or both. */
		if (wheel_of_doom == 2) {

			if (art) {
				/* Weapons. */
				if (tval_is_weapon_a(art)) {
					/* Blast items with bonuses, Deadliness more rarely. */
					art->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						art->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* All armours. */

					/* Reverse any magics. */
					if (art->to_h > 0) {
						art->to_h = -art->to_h;
					}
					if (art->to_d > 0) {
						art->to_d = -art->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!art->to_d && !art->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						art->to_h -= penalty;
						art->to_d -= penalty;
					}
				}

				/* Artifact might very well still have some value. */
				if ((art->to_d < 0) && (art->to_h < 0)) {
					art->cost -= 10000L;
				} else if ((art->to_d < 0) || (art->to_h < 0)) {
					art->cost -= 5000L;
				}
				if (art->cost < 0) {
					art->cost = 0;
				}
			} else {
				if (randint1(2) == 1) {
					/* One type of badness... */
					/* Blast items with bonuses, Deadliness more rarely. */
					obj->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						obj->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* ...or another. */
					/* Reverse any magics. */
					if (obj->to_h > 0) {
						obj->to_h = -obj->to_h;
					}
					if (obj->to_d > 0) {
						obj->to_d = -obj->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!obj->to_d && !obj->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						obj->to_h -= penalty;
						obj->to_d -= penalty;
					}
				}
			}
		}

		/* Make any bonuses negative, or strip all bonuses, and add a random
		 * stat or three with large negative bonuses. */
		if (wheel_of_doom == 3) {
			if (!one_in_(3)) {
				for (j = 0; j < STAT_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					if ((*bonus) > 0) {
						*bonus = -(*bonus);
					}
				}

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 30000L, 0);
				}
			} else {
				/* Iron Crown of Beruthiel, here we come... */
				penalty = -(randint1(5)) - 3;
				if (one_in_(3)) {
					penalty *= 5;
				}
				for (j = 0; j < OBJ_MOD_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					*bonus = 0;
				}
				if (one_in_(5)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_STR) *bonus = penalty;
						if (j == OBJ_MOD_DEX) *bonus = penalty;
						if (j == OBJ_MOD_CON) *bonus = penalty;
					}
				} else if (one_in_(4)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_WIS) *bonus = penalty;
						if (j == OBJ_MOD_INT) *bonus = penalty;
					}
				} else if (one_in_(6)) {
					int16_t *bonus = art ? &art->modifiers[OBJ_MOD_SPEED] :
						&obj->modifiers[OBJ_MOD_SPEED];
					*bonus = penalty;
				} else {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (one_in_(4)) {
							*bonus = penalty;
						}
					}
				}

				/* More curses for good measure... */
				num_curses += randint1(2);

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 60000L, 0);
				}
			}
		}

		/* Strip lots of other qualities. */
		if (wheel_of_doom == 4) {
			bitflag *flags = art ? art->flags : obj->flags;

			/* Powerful modifiers */
			if (art) {
				art->modifiers[OBJ_MOD_BLOWS] = 0;
			} else {
				obj->modifiers[OBJ_MOD_BLOWS] = 0;
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_SHOTS] = 0;
				} else {
					obj->modifiers[OBJ_MOD_SHOTS] = 0;
				}
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_MIGHT] = 0;
				} else {
					obj->modifiers[OBJ_MOD_MIGHT] = 0;
				}
			}

			/* Slays */
			for (i = 0; i < z_info->slay_max; i++) {
				bool *slay = NULL;
				if (art && art->slays) slay = &art->slays[i];
				if (obj && obj->slays) slay = &obj->slays[i];
				if (one_in_(3) && slay) *slay = false;
			}
			for (i = 0; i < z_info->slay_max; i++) {
				if (art && art->slays && art->slays[i]) break;
				if (obj && obj->slays && obj->slays[i]) break;
			}
			if (art && (i == z_info->slay_max)) {
				mem_free(art->slays);
				art->slays = NULL;
			} else if (obj && (i == z_info->slay_max)) {
				mem_free(obj->slays);
				obj->slays = NULL;
			}
			if (one_in_(3)) {
				of_off(flags, OF_PERFECT_BALANCE);
			}

			/* Brands */
			for (i = 0; i < z_info->brand_max; i++) {
				bool *brand = NULL;
				if (art && art->brands) brand = &art->brands[i];
				if (obj && obj->brands) brand = &obj->brands[i];
				if (one_in_(3) && brand) *brand = false;
			}
			for (i = 0; i < z_info->brand_max; i++) {
				if (art && art->brands && art->brands[i]) break;
				if (obj && obj->brands && obj->brands[i]) break;
			}
			if (art && (i == z_info->brand_max)) {
				mem_free(art->brands);
				art->brands = NULL;
			} else if (obj && (i == z_info->brand_max)) {
				mem_free(obj->brands);
				obj->brands = NULL;
			}

			/* Resists */
			for (i = 0; i < ELEM_HIGH_MAX; i++) {
				int16_t *level = art ? &art->el_info[i].res_level :
					&obj->el_info[i].res_level;
				if (one_in_(3) && (*level < RES_LEVEL_BASE)) {
					*level += 2 * (RES_LEVEL_BASE - *level);
				}
			}

			/* Flags */
			for (i = 0; i < z_info->property_max; i++) {
				struct obj_property *prop = &obj_properties[i];
				if (one_in_(3) && (prop->type == OBJ_PROPERTY_FLAG) &&
					(prop->subtype == OFT_PROT || prop->subtype == OFT_MISC)) {
					of_off(flags, prop->index);
				}
			}

			/* Artifact will still have some value. */
			if (art && art->cost > 0) {
				art->cost /= 3L;
			}
		}
	}

	/* Boundary control. */
	if (art && art->cost < 0) {
		art->cost = 0;
	}

	/* Apply curses. */
	while (num_curses) {
		int level = art ? art->alloc_min : obj->kind->alloc_min;
		int tval = art ? art->tval : obj->tval;
		int pick = randint1(z_info->curse_max - 1);
		int power = randint1(9) + 10 * m_bonus(9, level);
		if (!curses[pick].poss[tval]) {
			continue;
		}
		if (art) {
			append_artifact_curse(art, pick, power);
		} else {
			append_object_curse(obj, pick, power);
		}
		num_curses--;
	}
}